

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void server::formatsecs(vector<char> *timebuf,uint secs)

{
  uint uVar1;
  char *__s;
  bool bVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  char local_49;
  charbuf b;
  
  lVar7 = 0;
  bVar2 = false;
  do {
    if (lVar7 == 0x50) {
      return;
    }
    uVar1 = *(uint *)(timedivinfos + lVar7 + 8);
    if (secs < uVar1) {
      if ((lVar7 == 0x40) && (!bVar2)) goto LAB_00133c6e;
    }
    else {
      if (bVar2) {
        b.buf._0_1_ = 0x20;
        vector<char>::add(timebuf,(char *)&b);
      }
LAB_00133c6e:
      vector<char>::reserve(&b,timebuf,0xb);
      lVar8 = (long)b.maxlen;
      lVar4 = (long)b.len;
      iVar3 = snprintf((char *)CONCAT71(b.buf._1_7_,b.buf._0_1_),lVar8 - lVar4,"%u",
                       (ulong)secs / (ulong)uVar1);
      iVar6 = (int)(lVar8 - lVar4) + -1;
      if (iVar3 < iVar6) {
        iVar6 = iVar3;
      }
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      timebuf->ulen = timebuf->ulen + iVar6;
      local_49 = ' ';
      vector<char>::add(timebuf,&local_49);
      __s = *(char **)(timedivinfos + lVar7);
      sVar5 = strlen(__s);
      vector<char>::put(timebuf,__s,(int)sVar5);
      if ((int)((ulong)secs / (ulong)uVar1) != 1) {
        local_49 = 's';
        vector<char>::add(timebuf,&local_49);
      }
      if (secs % uVar1 == 0) {
        return;
      }
      bVar2 = true;
      secs = secs % uVar1;
    }
    lVar7 = lVar7 + 0x10;
  } while( true );
}

Assistant:

void formatsecs(vector<char> &timebuf, uint secs)
    {
        bool moded = false;
        const size_t tl = sizeof(timedivinfos)/sizeof(timedivinfos[0]);
        for(size_t i = 0; i < tl; i++)
        {
            uint t = secs / timedivinfos[i].timediv;
            if(!t && (i+1<tl || moded)) continue;
            secs %= timedivinfos[i].timediv;
            if(moded) timebuf.add(' ');
            moded = true;
            charbuf b = timebuf.reserve(10 + 1);
            int blen = b.remaining();
            int plen = snprintf(b.buf, blen, "%u", t);
            timebuf.advance(clamp(plen, 0, blen-1));
            timebuf.add(' ');
            timebuf.put(timedivinfos[i].name, strlen(timedivinfos[i].name));
            if(t != 1) timebuf.add('s');
            if(!secs) break;
        }
    }